

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

double flexbuffers::ReadSizedScalar<double,signed_char,short,float,double>
                 (uint8_t *data,uint8_t byte_width)

{
  int iVar1;
  
  if (byte_width < 4) {
    if (byte_width < 2) {
      iVar1 = (int)(char)*data;
    }
    else {
      iVar1 = (int)*(short *)data;
    }
    return (double)iVar1;
  }
  if (byte_width < 8) {
    return (double)*(float *)data;
  }
  return *(double *)data;
}

Assistant:

R ReadSizedScalar(const uint8_t *data, uint8_t byte_width) {
  return byte_width < 4
             ? (byte_width < 2
                    ? static_cast<R>(flatbuffers::ReadScalar<T1>(data))
                    : static_cast<R>(flatbuffers::ReadScalar<T2>(data)))
             : (byte_width < 8
                    ? static_cast<R>(flatbuffers::ReadScalar<T4>(data))
                    : static_cast<R>(flatbuffers::ReadScalar<T8>(data)));
}